

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::ListeningReporter::testRunEnded(ListeningReporter *this,TestRunStats *testRunStats)

{
  pointer puVar1;
  IStreamingReporter *pIVar2;
  unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_> *listener;
  pointer puVar3;
  
  puVar1 = (this->m_listeners).
           super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_listeners).
                super__Vector_base<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>,_std::allocator<std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pIVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
    (*pIVar2->_vptr_IStreamingReporter[0x12])(pIVar2,testRunStats);
  }
  pIVar2 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar2->_vptr_IStreamingReporter[0x12])(pIVar2,testRunStats);
  return;
}

Assistant:

void ListeningReporter::testRunEnded( TestRunStats const& testRunStats ) {
        for ( auto const& listener : m_listeners ) {
            listener->testRunEnded( testRunStats );
        }
        m_reporter->testRunEnded( testRunStats );
    }